

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O0

QString * __thiscall QTabBar::tabWhatsThis(QTabBar *this,int index)

{
  Tab *pTVar1;
  QTabBarPrivate *in_RDI;
  Tab *tab;
  QTabBarPrivate *d;
  QTabBarPrivate *this_00;
  
  this_00 = in_RDI;
  d_func((QTabBar *)0x6ae80c);
  pTVar1 = QTabBarPrivate::at(this_00,(int)((ulong)in_RDI >> 0x20));
  if (pTVar1 == (Tab *)0x0) {
    QString::QString((QString *)0x6ae849);
  }
  else {
    QString::QString((QString *)this_00,(QString *)in_RDI);
  }
  return (QString *)this_00;
}

Assistant:

QString QTabBar::tabWhatsThis(int index) const
{
    Q_D(const QTabBar);
    if (const QTabBarPrivate::Tab *tab = d->at(index))
        return tab->whatsThis;
    return QString();
}